

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void flatbuffers::kotlin::KotlinGenerator::GenerateGetter
               (CodeWriter *writer,string *name,string *type,function<void_()> *body)

{
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"name",&local_a1);
  CodeWriter::SetValue(writer,&local_a0,name);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"type",&local_a1);
  CodeWriter::SetValue(writer,&local_a0,type);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"val {{name}} : {{type}}",(allocator<char> *)&local_a0);
  CodeWriter::operator+=(writer,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"get() {",(allocator<char> *)&local_a0);
  CodeWriter::operator+=(writer,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + 1;
  std::function<void_()>::operator()(body);
  if (writer->cur_ident_lvl_ != 0) {
    writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"}",(allocator<char> *)&local_a0);
  CodeWriter::operator+=(writer,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (writer->cur_ident_lvl_ != 0) {
    writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + -1;
  }
  return;
}

Assistant:

static void GenerateGetter(CodeWriter &writer, const std::string &name,
                             const std::string &type,
                             const std::function<void()> &body) {
    // Generates Kotlin getter for properties
    // e.g.:
    // val prop: Mytype
    //     get() = {
    //       return x
    //     }
    writer.SetValue("name", name);
    writer.SetValue("type", type);
    writer += "val {{name}} : {{type}}";
    writer.IncrementIdentLevel();
    writer += "get() {";
    writer.IncrementIdentLevel();
    body();
    writer.DecrementIdentLevel();
    writer += "}";
    writer.DecrementIdentLevel();
  }